

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

appender fmt::v10::detail::
         write_significand<fmt::v10::appender,char,unsigned_int,fmt::v10::detail::digit_grouping<char>>
                   (appender out,uint significand,int significand_size,int integral_size,
                   char decimal_point,digit_grouping<char> *grouping)

{
  uint uVar1;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> bVar2;
  uint uVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  basic_string_view<char> digits;
  format_decimal_result<char_*> fVar7;
  char local_24b;
  char acStack_24a [10];
  undefined8 local_240;
  undefined1 *local_238;
  long lStack_230;
  ulong local_228;
  undefined1 local_220 [504];
  
  if ((grouping->thousands_sep_)._M_string_length == 0) {
    if (decimal_point == '\0') {
      fVar7 = format_decimal<char,unsigned_int>((char *)&local_240,significand,significand_size);
      pcVar5 = fVar7.end;
    }
    else {
      pcVar5 = (char *)((long)&local_240 + (long)significand_size + 1);
      uVar3 = significand_size - integral_size;
      pcVar6 = pcVar5;
      if (1 < (int)uVar3) {
        iVar4 = (uVar3 >> 1) + 1;
        uVar1 = significand;
        do {
          significand = uVar1 / 100;
          *(undefined2 *)(pcVar6 + -2) =
               *(undefined2 *)
                (
                "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                + (ulong)(uVar1 % 100) * 2);
          pcVar6 = pcVar6 + -2;
          iVar4 = iVar4 + -1;
          uVar1 = uVar1 / 100;
        } while (1 < iVar4);
      }
      uVar1 = significand;
      if ((uVar3 & 1) != 0) {
        uVar1 = significand / 10;
        pcVar6[-1] = (char)significand + (char)(significand / 10) * -10 | 0x30;
        pcVar6 = pcVar6 + -1;
      }
      pcVar6[-1] = decimal_point;
      format_decimal<char,unsigned_int>(pcVar6 + (-1 - (long)integral_size),uVar1,integral_size);
    }
    bVar2.container =
         (buffer<char> *)
         copy_str_noinline<char,char*,fmt::v10::appender>((char *)&local_240,pcVar5,out);
  }
  else {
    lStack_230 = 0;
    local_240 = &PTR_grow_001b6c80;
    local_228 = 500;
    local_238 = local_220;
    if (decimal_point == '\0') {
      fVar7 = format_decimal<char,unsigned_int>(&local_24b,significand,significand_size);
      pcVar5 = fVar7.end;
    }
    else {
      pcVar5 = acStack_24a + significand_size;
      uVar3 = significand_size - integral_size;
      pcVar6 = pcVar5;
      if (1 < (int)uVar3) {
        iVar4 = (uVar3 >> 1) + 1;
        uVar1 = significand;
        do {
          significand = uVar1 / 100;
          *(undefined2 *)(pcVar6 + -2) =
               *(undefined2 *)
                (
                "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                + (ulong)(uVar1 % 100) * 2);
          pcVar6 = pcVar6 + -2;
          iVar4 = iVar4 + -1;
          uVar1 = uVar1 / 100;
        } while (1 < iVar4);
      }
      uVar1 = significand;
      if ((uVar3 & 1) != 0) {
        uVar1 = significand / 10;
        pcVar6[-1] = (char)significand + (char)(significand / 10) * -10 | 0x30;
        pcVar6 = pcVar6 + -1;
      }
      pcVar6[-1] = decimal_point;
      format_decimal<char,unsigned_int>(pcVar6 + (-1 - (long)integral_size),uVar1,integral_size);
    }
    copy_str_noinline<char,char*,fmt::v10::appender>(&local_24b,pcVar5,(appender)&local_240);
    if (integral_size < 0) {
      assert_fail("/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/fmt/include/fmt/core.h"
                  ,0x17a,"negative value");
    }
    digits.size_._0_4_ = integral_size;
    digits.data_ = local_238;
    digits.size_._4_4_ = 0;
    digit_grouping<char>::apply<fmt::v10::appender,char>(grouping,out,digits);
    bVar2.container =
         (buffer<char> *)
         copy_str_noinline<char,char*,fmt::v10::appender>
                   (local_238 + (uint)integral_size,local_238 + lStack_230,out);
    if (local_238 != local_220) {
      operator_delete(local_238,local_228);
    }
  }
  return (appender)(back_insert_iterator<fmt::v10::detail::buffer<char>_>)bVar2.container;
}

Assistant:

FMT_CONSTEXPR20 auto write_significand(OutputIt out, T significand,
                                       int significand_size, int integral_size,
                                       Char decimal_point,
                                       const Grouping& grouping) -> OutputIt {
  if (!grouping.has_separator()) {
    return write_significand(out, significand, significand_size, integral_size,
                             decimal_point);
  }
  auto buffer = basic_memory_buffer<Char>();
  write_significand(buffer_appender<Char>(buffer), significand,
                    significand_size, integral_size, decimal_point);
  grouping.apply(
      out, basic_string_view<Char>(buffer.data(), to_unsigned(integral_size)));
  return detail::copy_str_noinline<Char>(buffer.data() + integral_size,
                                         buffer.end(), out);
}